

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>> iVar1;
  uint uVar2;
  hex_writer f;
  bool bVar3;
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>> *in_RDI;
  basic_format_specs<wchar_t> *in_stack_00000020;
  int in_stack_0000002c;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_00000030;
  string_view in_stack_00000038;
  int num_digits;
  undefined8 in_stack_00000058;
  
  bVar3 = core_format_specs::has((core_format_specs *)(*(long *)(in_RDI + 8) + 0xc),8);
  if (bVar3) {
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x18] =
         (int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>)0x30;
    iVar1 = *(int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>> *)
             (*(long *)(in_RDI + 8) + 0x11);
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x18] = iVar1;
  }
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  ::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::count_digits<4u>(in_RDI);
  get_prefix((int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *)0x245eb2);
  f._8_8_ = in_stack_00000058;
  f.self = this;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
            (in_stack_00000030,in_stack_0000002c,in_stack_00000038,in_stack_00000020,f);
  return;
}

Assistant:

void on_hex() {
      if (spec.has(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type);
      }
      int num_digits = count_digits<4>();
      writer.write_int(num_digits, get_prefix(), spec,
                       hex_writer{*this, num_digits});
    }